

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fClippingTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles2::Functional::(anonymous_namespace)::genClippingPointInfoString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Vec4 *p)

{
  float fVar1;
  float fVar2;
  ostringstream msg;
  ostream oStack_188;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oStack_188);
  fVar2 = *(float *)this;
  fVar1 = *(float *)(this + 0xc);
  if (fVar2 < -fVar1) {
    std::operator<<(&oStack_188,"\t(-X clip)");
    fVar2 = *(float *)this;
    fVar1 = *(float *)(this + 0xc);
  }
  if (fVar1 < fVar2) {
    std::operator<<(&oStack_188,"\t(+X clip)");
    fVar1 = *(float *)(this + 0xc);
  }
  fVar2 = *(float *)(this + 4);
  if (fVar2 < -fVar1) {
    std::operator<<(&oStack_188,"\t(-Y clip)");
    fVar2 = *(float *)(this + 4);
    fVar1 = *(float *)(this + 0xc);
  }
  if (fVar1 < fVar2) {
    std::operator<<(&oStack_188,"\t(+Y clip)");
    fVar1 = *(float *)(this + 0xc);
  }
  fVar2 = *(float *)(this + 8);
  if (fVar2 < -fVar1) {
    std::operator<<(&oStack_188,"\t(-Z clip)");
    fVar2 = *(float *)(this + 8);
    fVar1 = *(float *)(this + 0xc);
  }
  if (fVar1 < fVar2) {
    std::operator<<(&oStack_188,"\t(+Z clip)");
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oStack_188);
  return __return_storage_ptr__;
}

Assistant:

std::string genClippingPointInfoString(const tcu::Vec4& p)
{
	std::ostringstream msg;

	if (p.x() < -p.w())		msg << "\t(-X clip)";
	if (p.x() >  p.w())		msg << "\t(+X clip)";
	if (p.y() < -p.w())		msg << "\t(-Y clip)";
	if (p.y() >  p.w())		msg << "\t(+Y clip)";
	if (p.z() < -p.w())		msg << "\t(-Z clip)";
	if (p.z() >  p.w())		msg << "\t(+Z clip)";

	return msg.str();
}